

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::SwitchStatement(SQCompiler *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  SQUnsignedInteger SVar4;
  SQInteger SVar5;
  SQUnsignedInteger SVar6;
  long *in_RDI;
  SQObject SVar7;
  SQInteger oldouters_1;
  SQScope __oldscope___1;
  SQInteger oldouters;
  SQScope __oldscope__;
  bool local;
  SQInteger eqtarget;
  SQInteger trg;
  SQInteger __nbreaks__;
  SQInteger skipcondjmp;
  SQInteger tonextcondjmp;
  bool bfirst;
  SQInteger expr;
  longlong *in_stack_fffffffffffffee8;
  SQCompiler *in_stack_fffffffffffffef0;
  SQFuncState *in_stack_fffffffffffffef8;
  SQFuncState *in_stack_ffffffffffffff00;
  SQFuncState *in_stack_ffffffffffffff08;
  SQCompiler *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  SQInteger in_stack_ffffffffffffff38;
  long lVar8;
  SQFuncState *in_stack_ffffffffffffff40;
  SQFuncState *this_00;
  SQObjectValue in_stack_ffffffffffffff90;
  SQCompiler *in_stack_ffffffffffffff98;
  SQCompiler *this_01;
  SQFuncState *local_58;
  SQCompiler *this_02;
  
  Lex(in_stack_fffffffffffffef0);
  Expect(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90.nInteger);
  CommaExpr(in_stack_fffffffffffffef0);
  Expect(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90.nInteger);
  Expect(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90.nInteger);
  SQFuncState::TopTarget((SQFuncState *)0x1283c5);
  bVar3 = true;
  this_02 = (SQCompiler *)0xffffffffffffffff;
  local_58 = (SQFuncState *)0xffffffffffffffff;
  SVar4 = sqvector<long_long>::size((sqvector<long_long> *)(in_RDI[1] + 0x48));
  this_01 = (SQCompiler *)0x0;
  sqvector<long_long>::push_back
            ((sqvector<long_long> *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  while (*in_RDI == 300) {
    if (!bVar3) {
      SQFuncState::AddInstruction
                ((SQFuncState *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (SQOpcode)((ulong)in_RDI >> 0x20),(SQInteger)in_stack_ffffffffffffff10,
                 (SQInteger)in_stack_ffffffffffffff08,(SQInteger)in_stack_ffffffffffffff00,
                 (SQInteger)in_stack_fffffffffffffef8);
      in_stack_ffffffffffffff10 = this_02;
      local_58 = (SQFuncState *)SQFuncState::GetCurrentPos((SQFuncState *)0x128481);
      in_stack_ffffffffffffff08 = (SQFuncState *)in_RDI[1];
      this_02 = in_stack_ffffffffffffff10;
      SQFuncState::GetCurrentPos((SQFuncState *)0x1284b0);
      SQFuncState::SetInstructionParam
                ((SQFuncState *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (SQInteger)in_RDI,(SQInteger)in_stack_ffffffffffffff10,
                 (SQInteger)in_stack_ffffffffffffff08);
    }
    Lex(in_stack_fffffffffffffef0);
    Expression(this_02);
    SVar7 = Expect(this_01,in_stack_ffffffffffffff90.nInteger);
    in_stack_ffffffffffffff90 = SVar7._unVal;
    SQFuncState::PopTarget(in_stack_ffffffffffffff00);
    bVar3 = SQFuncState::IsLocal
                      (in_stack_fffffffffffffef8,(SQUnsignedInteger)in_stack_fffffffffffffef0);
    if (bVar3) {
      SQFuncState::PushTarget(in_stack_fffffffffffffef8,(SQInteger)in_stack_fffffffffffffef0);
    }
    SQFuncState::AddInstruction
              ((SQFuncState *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (SQOpcode)((ulong)in_RDI >> 0x20),(SQInteger)in_stack_ffffffffffffff10,
               (SQInteger)in_stack_ffffffffffffff08,(SQInteger)in_stack_ffffffffffffff00,
               (SQInteger)in_stack_fffffffffffffef8);
    SQFuncState::AddInstruction
              ((SQFuncState *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (SQOpcode)((ulong)in_RDI >> 0x20),(SQInteger)in_stack_ffffffffffffff10,
               (SQInteger)in_stack_ffffffffffffff08,(SQInteger)in_stack_ffffffffffffff00,
               (SQInteger)in_stack_fffffffffffffef8);
    if (bVar3) {
      SQFuncState::PopTarget(in_stack_ffffffffffffff00);
    }
    if (local_58 != (SQFuncState *)0xffffffffffffffff) {
      in_stack_fffffffffffffef8 = (SQFuncState *)in_RDI[1];
      in_stack_ffffffffffffff00 = local_58;
      SQFuncState::GetCurrentPos((SQFuncState *)0x12860f);
      SQFuncState::SetInstructionParam
                ((SQFuncState *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (SQInteger)in_RDI,(SQInteger)in_stack_ffffffffffffff10,
                 (SQInteger)in_stack_ffffffffffffff08);
    }
    this_02 = (SQCompiler *)SQFuncState::GetCurrentPos((SQFuncState *)0x12863c);
    lVar8 = in_RDI[0x1d];
    lVar1 = in_RDI[0x1e];
    in_RDI[0x1d] = *(long *)(in_RDI[1] + 0x1c8);
    SVar5 = SQFuncState::GetStackSize((SQFuncState *)0x128682);
    in_RDI[0x1e] = SVar5;
    Statements(in_stack_fffffffffffffef0);
    lVar2 = *(long *)(in_RDI[1] + 0x1c8);
    SVar5 = SQFuncState::GetStackSize((SQFuncState *)0x1286b1);
    if ((SVar5 != in_RDI[0x1e]) &&
       (SQFuncState::SetStackSize(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38),
       lVar2 != *(long *)(in_RDI[1] + 0x1c8))) {
      SQFuncState::AddInstruction
                ((SQFuncState *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (SQOpcode)((ulong)in_RDI >> 0x20),(SQInteger)in_stack_ffffffffffffff10,
                 (SQInteger)in_stack_ffffffffffffff08,(SQInteger)in_stack_ffffffffffffff00,
                 (SQInteger)in_stack_fffffffffffffef8);
    }
    in_RDI[0x1d] = lVar8;
    in_RDI[0x1e] = lVar1;
    bVar3 = false;
  }
  if (this_02 != (SQCompiler *)0xffffffffffffffff) {
    SQFuncState::GetCurrentPos((SQFuncState *)0x12876d);
    SQFuncState::SetInstructionParam
              ((SQFuncState *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (SQInteger)in_RDI,(SQInteger)in_stack_ffffffffffffff10,
               (SQInteger)in_stack_ffffffffffffff08);
    in_stack_fffffffffffffef0 = this_02;
  }
  if (*in_RDI == 0x12d) {
    Lex(in_stack_fffffffffffffef0);
    Expect(this_01,in_stack_ffffffffffffff90.nInteger);
    lVar8 = in_RDI[0x1d];
    this_00 = (SQFuncState *)in_RDI[0x1e];
    in_RDI[0x1d] = *(long *)(in_RDI[1] + 0x1c8);
    SVar5 = SQFuncState::GetStackSize((SQFuncState *)0x1287f9);
    in_RDI[0x1e] = SVar5;
    Statements(in_stack_fffffffffffffef0);
    lVar1 = *(long *)(in_RDI[1] + 0x1c8);
    SVar5 = SQFuncState::GetStackSize((SQFuncState *)0x128828);
    if ((SVar5 != in_RDI[0x1e]) &&
       (SQFuncState::SetStackSize(this_00,lVar8), lVar1 != *(long *)(in_RDI[1] + 0x1c8))) {
      SQFuncState::AddInstruction
                ((SQFuncState *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (SQOpcode)((ulong)in_RDI >> 0x20),(SQInteger)in_stack_ffffffffffffff10,
                 (SQInteger)in_stack_ffffffffffffff08,(SQInteger)in_stack_ffffffffffffff00,
                 (SQInteger)in_stack_fffffffffffffef8);
    }
    in_RDI[0x1d] = lVar8;
    in_RDI[0x1e] = (long)this_00;
  }
  Expect(this_01,in_stack_ffffffffffffff90.nInteger);
  SQFuncState::PopTarget(in_stack_ffffffffffffff00);
  SVar6 = sqvector<long_long>::size((sqvector<long_long> *)(in_RDI[1] + 0x48));
  if (0 < (long)(SVar6 - SVar4)) {
    ResolveBreaks(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                  (SQInteger)in_stack_ffffffffffffff00);
  }
  sqvector<long_long>::pop_back((sqvector<long_long> *)(in_RDI[1] + 0x170));
  return;
}

Assistant:

void SwitchStatement()
    {
        Lex(); Expect(_SC('(')); CommaExpr(); Expect(_SC(')'));
        Expect(_SC('{'));
        SQInteger expr = _fs->TopTarget();
        bool bfirst = true;
        SQInteger tonextcondjmp = -1;
        SQInteger skipcondjmp = -1;
        SQInteger __nbreaks__ = _fs->_unresolvedbreaks.size();
        _fs->_breaktargets.push_back(0);
        while(_token == TK_CASE) {
            if(!bfirst) {
                _fs->AddInstruction(_OP_JMP, 0, 0);
                skipcondjmp = _fs->GetCurrentPos();
                _fs->SetInstructionParam(tonextcondjmp, 1, _fs->GetCurrentPos() - tonextcondjmp);
            }
            //condition
            Lex(); Expression(); Expect(_SC(':'));
            SQInteger trg = _fs->PopTarget();
            SQInteger eqtarget = trg;
            bool local = _fs->IsLocal(trg);
            if(local) {
                eqtarget = _fs->PushTarget(); //we need to allocate a extra reg
            }
            _fs->AddInstruction(_OP_EQ, eqtarget, trg, expr);
            _fs->AddInstruction(_OP_JZ, eqtarget, 0);
            if(local) {
                _fs->PopTarget();
            }

            //end condition
            if(skipcondjmp != -1) {
                _fs->SetInstructionParam(skipcondjmp, 1, (_fs->GetCurrentPos() - skipcondjmp));
            }
            tonextcondjmp = _fs->GetCurrentPos();
            BEGIN_SCOPE();
            Statements();
            END_SCOPE();
            bfirst = false;
        }
        if(tonextcondjmp != -1)
            _fs->SetInstructionParam(tonextcondjmp, 1, _fs->GetCurrentPos() - tonextcondjmp);
        if(_token == TK_DEFAULT) {
            Lex(); Expect(_SC(':'));
            BEGIN_SCOPE();
            Statements();
            END_SCOPE();
        }
        Expect(_SC('}'));
        _fs->PopTarget();
        __nbreaks__ = _fs->_unresolvedbreaks.size() - __nbreaks__;
        if(__nbreaks__ > 0)ResolveBreaks(_fs, __nbreaks__);
        _fs->_breaktargets.pop_back();
    }